

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

string * __thiscall
google::protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Message *msg1,Message *msg2)

{
  bool bVar1;
  FieldDescriptor *pFVar2;
  FieldDescriptor *key;
  string *extraout_RAX;
  AlphaNum *in_R8;
  char *in_R9;
  MessageDifferencer differencer;
  string local_290;
  undefined1 local_270 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  string local_240;
  AlphaNum local_210;
  MessageDifferencer local_1e0;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  util::MessageDifferencer::MessageDifferencer(&local_1e0);
  util::MessageDifferencer::ReportDifferencesToString(&local_1e0,__return_storage_ptr__);
  if (*(char *)((long)this + 0x1090) == '\x01') {
    util::MessageDifferencer::set_message_field_comparison(&local_1e0,EQUIVALENT);
  }
  if (*(string **)((long)this + 0x1100) != (string *)0x0) {
    pFVar2 = protobuf::anon_unknown_0::GetFieldDescriptor
                       ((anon_unknown_0 *)msg1,*(Message **)((long)this + 0x10f8),
                        *(string **)((long)this + 0x1100));
    util::MessageDifferencer::IgnoreField(&local_1e0,pFVar2);
  }
  if (*(char *)((long)this + 0x1091) == '\x01') {
    util::MessageDifferencer::set_repeated_field_comparison(&local_1e0,AS_SET);
  }
  if (*(string **)((long)this + 0x10a0) != (string *)0x0) {
    pFVar2 = protobuf::anon_unknown_0::GetFieldDescriptor
                       ((anon_unknown_0 *)msg1,*(Message **)((long)this + 0x1098),
                        *(string **)((long)this + 0x10a0));
    util::MessageDifferencer::TreatAsSet(&local_1e0,pFVar2);
  }
  if ((*(string **)((long)this + 0x10c0) != (string *)0x0) && (*(long *)((long)this + 0x10e0) != 0))
  {
    pFVar2 = protobuf::anon_unknown_0::GetFieldDescriptor
                       ((anon_unknown_0 *)msg1,*(Message **)((long)this + 0x10b8),
                        *(string **)((long)this + 0x10c0));
    local_240._M_string_length = *(size_type *)((long)this + 0x10b8);
    local_240._M_dataplus._M_p = *(pointer *)((long)this + 0x10c0);
    local_270 = (undefined1  [8])0x1;
    local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13904b6;
    local_210.piece_._M_str = *(char **)((long)this + 0x10d8);
    local_210.piece_._M_len = *(undefined8 *)((long)this + 0x10e0);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_290,(lts_20250127 *)&local_240,(AlphaNum *)local_270,&local_210,in_R8);
    key = protobuf::anon_unknown_0::GetFieldDescriptor
                    ((anon_unknown_0 *)msg1,(Message *)local_290._M_dataplus._M_p,
                     (string *)local_290._M_string_length);
    util::MessageDifferencer::TreatAsMap(&local_1e0,pFVar2,key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = util::MessageDifferencer::Compare(&local_1e0,msg1,msg2);
  local_270[0] = !bVar1;
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_240,(internal *)local_270,(AssertionResult *)0x122213d,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb9f,local_240._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_210.piece_._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_210.piece_._M_len + 8))();
    }
    if (local_268 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_268,local_268);
    }
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1e0);
  return extraout_RAX;
}

Assistant:

std::string Run(const Message& msg1, const Message& msg2) {
    std::string output;

    // Setup the comparison.
    util::MessageDifferencer differencer;
    differencer.ReportDifferencesToString(&output);

    if (use_equivalency_) {
      differencer.set_message_field_comparison(
          util::MessageDifferencer::EQUIVALENT);
    }

    SetSpecialFieldOption(msg1, &differencer);

    // Conduct the comparison.
    EXPECT_FALSE(differencer.Compare(msg1, msg2));

    return output;
  }